

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkReassignIds(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int *piVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  int iVar5;
  long lVar6;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x716,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  p = Vec_PtrAlloc(pNtk->nObjs);
  pAVar3 = Abc_AigConst1(pNtk);
  if (pAVar3->Id == 0) {
    Vec_PtrPush(p,pAVar3);
    for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,iVar5);
      pAVar4->Id = p->nSize;
      Vec_PtrPush(p,pAVar4);
    }
    for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,iVar5);
      pAVar4->Id = p->nSize;
      Vec_PtrPush(p,pAVar4);
    }
    for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = Abc_NtkBox(pNtk,iVar5);
      pAVar4->Id = p->nSize;
      Vec_PtrPush(p,pAVar4);
      for (lVar6 = 0; lVar6 < (pAVar4->vFanins).nSize; lVar6 = lVar6 + 1) {
        pvVar1 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar6]];
        *(int *)((long)pvVar1 + 0x10) = p->nSize;
        Vec_PtrPush(p,pvVar1);
      }
      for (lVar6 = 0; lVar6 < (pAVar4->vFanouts).nSize; lVar6 = lVar6 + 1) {
        pvVar1 = pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar6]];
        *(int *)((long)pvVar1 + 0x10) = p->nSize;
        Vec_PtrPush(p,pvVar1);
      }
    }
    p_00 = Abc_AigDfs(pNtk,1,0);
    for (iVar5 = 0; iVar5 < p_00->nSize; iVar5 = iVar5 + 1) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
      if (pAVar4 != pAVar3) {
        pAVar4->Id = p->nSize;
        Vec_PtrPush(p,pAVar4);
      }
    }
    Vec_PtrFree(p_00);
    if (p->nSize == pNtk->nObjs) {
      for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          for (lVar6 = 0; lVar6 < (pAVar3->vFanins).nSize; lVar6 = lVar6 + 1) {
            piVar2 = (pAVar3->vFanins).pArray;
            piVar2[lVar6] = *(int *)((long)pAVar3->pNtk->vObjs->pArray[piVar2[lVar6]] + 0x10);
          }
          for (lVar6 = 0; lVar6 < (pAVar3->vFanouts).nSize; lVar6 = lVar6 + 1) {
            piVar2 = (pAVar3->vFanouts).pArray;
            piVar2[lVar6] = *(int *)((long)pAVar3->pNtk->vObjs->pArray[piVar2[lVar6]] + 0x10);
          }
        }
      }
      Vec_PtrFree(pNtk->vObjs);
      pNtk->vObjs = p;
      Abc_AigRehash((Abc_Aig_t *)pNtk->pManFunc);
      return;
    }
    __assert_fail("Vec_PtrSize(vObjsNew) == pNtk->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x744,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
  }
  __assert_fail("pConst1->Id == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0x71c,"void Abc_NtkReassignIds(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkReassignIds( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vObjsNew;
    Abc_Obj_t * pNode, * pTemp, * pConst1;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
//printf( "Total = %d. Current = %d.\n", Abc_NtkObjNumMax(pNtk), Abc_NtkObjNum(pNtk) );
    // start the array of objects with new IDs
    vObjsNew = Vec_PtrAlloc( pNtk->nObjs );
    // put constant node first
    pConst1 = Abc_AigConst1(pNtk);
    assert( pConst1->Id == 0 );
    Vec_PtrPush( vObjsNew, pConst1 );
    // put PI nodes next
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put PO nodes next
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    // put latches and their inputs/outputs next
    Abc_NtkForEachBox( pNtk, pNode, i )
    {
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
        Abc_ObjForEachFanin( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
        Abc_ObjForEachFanout( pNode, pTemp, k )
        {
            pTemp->Id = Vec_PtrSize( vObjsNew );
            Vec_PtrPush( vObjsNew, pTemp );
        }
    }
    // finally, internal nodes in the DFS order
    vNodes = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( pNode == pConst1 )
            continue;
        pNode->Id = Vec_PtrSize( vObjsNew );
        Vec_PtrPush( vObjsNew, pNode );
    }
    Vec_PtrFree( vNodes );
    assert( Vec_PtrSize(vObjsNew) == pNtk->nObjs );

    // update the fanin/fanout arrays
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pTemp, k )
            pNode->vFanins.pArray[k] = pTemp->Id;
        Abc_ObjForEachFanout( pNode, pTemp, k )
            pNode->vFanouts.pArray[k] = pTemp->Id;
    }

    // replace the array of objs
    Vec_PtrFree( pNtk->vObjs );
    pNtk->vObjs = vObjsNew;

    // rehash the AIG
    Abc_AigRehash( (Abc_Aig_t *)pNtk->pManFunc );

    // update the name manager!!!
}